

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O0

char * mem_type(uint8_t version,uint16_t start)

{
  uint8_t ram_type;
  uint16_t start_local;
  char *pcStack_10;
  uint8_t version_local;
  
  if (version == '\x10') {
    switch(bios->data[start] & 0xf) {
    case 0:
      pcStack_10 = "DDR2";
      break;
    case 1:
      pcStack_10 = "DDR3";
      break;
    case 2:
      pcStack_10 = "GDDR3";
      break;
    case 3:
      pcStack_10 = "GDDR5";
      break;
    default:
      pcStack_10 = "Unknown ram type";
      break;
    case 6:
      pcStack_10 = "HBM2";
      break;
    case 8:
      pcStack_10 = "GDDR5X";
      break;
    case 9:
      pcStack_10 = "GDDR6";
      break;
    case 0xf:
      pcStack_10 = "Skip";
    }
  }
  else {
    pcStack_10 = "unknown table version (0x%x)\n";
  }
  return pcStack_10;
}

Assistant:

const char * mem_type(uint8_t version, uint16_t start)
{
	uint8_t ram_type = bios->data[start] & 0x0f;

	if (version != 0x10)
		return "unknown table version (0x%x)\n";

	switch (ram_type) {
	case 0:
		return "DDR2";
		break;
	case 1:
		return "DDR3";
		break;
	case 2:
		return "GDDR3";
		break;
	case 3:
		return "GDDR5";
		break;
	case 6:
		return "HBM2";
		break;
	case 8:
		return "GDDR5X";
		break;
	case 9:
		return "GDDR6";
		break;
	case 15:
		return "Skip";
		break;
	default:
		return "Unknown ram type";
	}
}